

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

int __thiscall httplib::ThreadPool::shutdown(ThreadPool *this,int __fd,int __how)

{
  bool bVar1;
  undefined7 extraout_var;
  thread *t;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> local_28
  ;
  vector<std::thread,_std::allocator<std::thread>_> *local_20;
  ThreadPool *local_8;
  
  local_8 = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)this,in_stack_ffffffffffffffb8);
  this->shutdown_ = true;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this);
  std::condition_variable::notify_all();
  local_20 = &this->threads_;
  local_28._M_current =
       (thread *)
       std::vector<std::thread,_std::allocator<std::thread>_>::begin
                 ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffffb8);
  std::vector<std::thread,_std::allocator<std::thread>_>::end
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)this,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&local_28);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&local_28);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void shutdown() override {
    // Stop all worker threads...
    {
      std::unique_lock<std::mutex> lock(mutex_);
      shutdown_ = true;
    }

    cond_.notify_all();

    // Join...
    for (auto &t : threads_) {
      t.join();
    }
  }